

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_allocator.hpp
# Opt level: O0

Span * __thiscall
tcmalloc::FixedAllocator<tcmalloc::Span>::AllocFromArea(FixedAllocator<tcmalloc::Span> *this)

{
  Span *pSVar1;
  char *pcVar2;
  void *result;
  void *ptr;
  FixedAllocator<tcmalloc::Span> *this_local;
  
  if (this->area_free_ < 0x48) {
    pcVar2 = (char *)SystemAlloc(0x8000000);
    if (pcVar2 == (char *)0xffffffffffffffff) {
      return (Span *)0x0;
    }
    this->area_ = pcVar2;
    this->area_free_ = 0x8000000;
  }
  pSVar1 = (Span *)this->area_;
  this->area_ = this->area_ + 0x48;
  this->area_free_ = this->area_free_ - 0x48;
  return pSVar1;
}

Assistant:

T *AllocFromArea() {
        if (area_free_ < sizeof(T)) {
            void *ptr = SystemAlloc(areaSize_);
            if (ptr == (void *) (-1)) {
                return nullptr;
            }
            area_ = (char *) ptr;
            area_free_ = areaSize_;
        }
        void *result = area_;
        area_ += sizeof(T);
        area_free_ -= sizeof(T);
        return reinterpret_cast<T *>(result);
    }